

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SPIRExpression * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::allocate<spirv_cross::SPIRExpression&>
          (ObjectPool<spirv_cross::SPIRExpression> *this,SPIRExpression *p)

{
  Vector<spirv_cross::SPIRExpression_*> *this_00;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ID IVar5;
  _Tuple_impl<0UL,_spirv_cross::SPIRExpression_*,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
  _Var6;
  _Head_base<0UL,_spirv_cross::SPIRExpression_*,_false> _Var7;
  size_t sVar8;
  ulong uVar9;
  SPIRExpression *pSVar10;
  
  this_00 = &this->vacants;
  sVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
  if (sVar8 == 0) {
    sVar8 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
            .buffer_size;
    uVar9 = (ulong)(this->start_object_count << ((byte)sVar8 & 0x1f));
    _Var6.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>)malloc(uVar9 * 0xb8);
    if (_Var6.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl ==
        (SPIRExpression *)0x0) {
      return (SPIRExpression *)0x0;
    }
    if (uVar9 != 0) {
      sVar8 = 0;
      _Var7._M_head_impl =
           (SPIRExpression *)
           _Var6.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
      do {
        SmallVector<spirv_cross::SPIRExpression_*,_0UL>::reserve(this_00,sVar8 + 1);
        sVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
        (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.ptr[sVar8] =
             _Var7._M_head_impl;
        sVar8 = sVar8 + 1;
        (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size = sVar8;
        _Var7._M_head_impl = _Var7._M_head_impl + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      sVar8 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
              .buffer_size;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,_8UL>
    ::reserve(&this->memory,sVar8 + 1);
    sVar8 = (this->memory).
            super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
            .buffer_size;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
    .ptr[sVar8]._M_t.
    super___uniq_ptr_impl<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_spirv_cross::SPIRExpression_*,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>
    .super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false> =
         _Var6.super__Head_base<0UL,_spirv_cross::SPIRExpression_*,_false>._M_head_impl;
    (this->memory).
    super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
    .buffer_size = sVar8 + 1;
    sVar8 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
    pSVar10 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.ptr[sVar8 - 1];
    if (sVar8 == 0) goto LAB_0024864c;
  }
  else {
    pSVar10 = (this_00->super_VectorView<spirv_cross::SPIRExpression_*>).ptr[sVar8 - 1];
  }
  SmallVector<spirv_cross::SPIRExpression_*,_0UL>::resize(this_00,sVar8 - 1);
LAB_0024864c:
  (pSVar10->super_IVariant).self.id = (p->super_IVariant).self.id;
  (pSVar10->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRExpression_003f9300;
  *(undefined4 *)&(pSVar10->super_IVariant).field_0xc =
       *(undefined4 *)&(p->super_IVariant).field_0xc;
  (pSVar10->expression)._M_dataplus._M_p = (pointer)&(pSVar10->expression).field_2;
  pcVar1 = (p->expression)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&pSVar10->expression,pcVar1,pcVar1 + (p->expression)._M_string_length);
  bVar2 = p->need_transpose;
  bVar3 = p->access_chain;
  bVar4 = p->access_meshlet_position_y;
  pSVar10->immutable = p->immutable;
  pSVar10->need_transpose = bVar2;
  pSVar10->access_chain = bVar3;
  pSVar10->access_meshlet_position_y = bVar4;
  IVar5.id = (p->loaded_from).id;
  pSVar10->expression_type = (TypeID)(p->expression_type).id;
  pSVar10->loaded_from = (ID)IVar5.id;
  (pSVar10->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  (pSVar10->expression_dependencies).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar10->expression_dependencies).stack_storage;
  (pSVar10->expression_dependencies).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar10->expression_dependencies,&p->expression_dependencies);
  (pSVar10->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
  .buffer_size = 0;
  (pSVar10->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
  .ptr = (TypedID<(spirv_cross::Types)0> *)&(pSVar10->implied_read_expressions).stack_storage;
  (pSVar10->implied_read_expressions).buffer_capacity = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
            (&pSVar10->implied_read_expressions,&p->implied_read_expressions);
  pSVar10->emitted_loop_level = p->emitted_loop_level;
  return pSVar10;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}